

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

iterator __thiscall
llvm::SmallVectorImpl<void_*>::erase
          (SmallVectorImpl<void_*> *this,const_iterator CS,const_iterator CE)

{
  const_iterator ppvVar1;
  size_t __n;
  
  ppvVar1 = (const_iterator)
            (this->super_SmallVectorTemplateBase<void_*,_true>).
            super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
  if (CS < ppvVar1) {
    __assert_fail("S >= this->begin() && \"Range to erase is out of bounds.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                  ,0x1c6,
                  "iterator llvm::SmallVectorImpl<void *>::erase(const_iterator, const_iterator) [T = void *]"
                 );
  }
  if (CS <= CE) {
    __n = (long)(ppvVar1 +
                (this->super_SmallVectorTemplateBase<void_*,_true>).
                super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size) - (long)CE
    ;
    if (CE <= ppvVar1 + (this->super_SmallVectorTemplateBase<void_*,_true>).
                        super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size) {
      if (__n != 0) {
        memmove(CS,CE,__n);
        ppvVar1 = (const_iterator)
                  (this->super_SmallVectorTemplateBase<void_*,_true>).
                  super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
      }
      SmallVectorBase::set_size
                ((SmallVectorBase *)this,(long)((long)CS + (__n - (long)ppvVar1)) >> 3);
      return CS;
    }
    __assert_fail("E <= this->end() && \"Trying to erase past the end.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                  ,0x1c8,
                  "iterator llvm::SmallVectorImpl<void *>::erase(const_iterator, const_iterator) [T = void *]"
                 );
  }
  __assert_fail("S <= E && \"Trying to erase invalid range.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x1c7,
                "iterator llvm::SmallVectorImpl<void *>::erase(const_iterator, const_iterator) [T = void *]"
               );
}

Assistant:

iterator erase(const_iterator CS, const_iterator CE) {
    // Just cast away constness because this is a non-const member function.
    iterator S = const_cast<iterator>(CS);
    iterator E = const_cast<iterator>(CE);

    assert(S >= this->begin() && "Range to erase is out of bounds.");
    assert(S <= E && "Trying to erase invalid range.");
    assert(E <= this->end() && "Trying to erase past the end.");

    iterator N = S;
    // Shift all elts down.
    iterator I = std::move(E, this->end(), S);
    // Drop the last elts.
    this->destroy_range(I, this->end());
    this->set_size(I - this->begin());
    return(N);
  }